

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedDatum.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::FixedDatum::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,FixedDatum *this)

{
  ostream *poVar1;
  KINT32 Value;
  KString local_1d8;
  uint local_1a4;
  stringstream local_1a0 [4];
  NetToKUINT32 NetToSys;
  KStringStream ss;
  ostream local_190 [376];
  FixedDatum *local_18;
  FixedDatum *this_local;
  
  local_18 = this;
  this_local = (FixedDatum *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  NetToDataType<unsigned_int>::NetToDataType
            ((NetToDataType<unsigned_int> *)&local_1a4,this->m_cDatumValue,false);
  poVar1 = std::operator<<(local_190,"Fixed Datum:");
  poVar1 = std::operator<<(poVar1,"\n\tID:          ");
  ENUMS::GetEnumAsStringDatumID_abi_cxx11_(&local_1d8,(ENUMS *)(ulong)this->m_ui32DatumID,Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d8);
  poVar1 = std::operator<<(poVar1,"\n\tValue(UI32): ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1a4);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString FixedDatum::GetAsString() const
{
    KStringStream ss;

    NetToKUINT32 NetToSys( m_cDatumValue, false );

    // TODO: maybe determine what the data type should be when printing out, this
    // could be a lot of work.
    ss << "Fixed Datum:"
       << "\n\tID:          " << GetEnumAsStringDatumID( m_ui32DatumID )
       << "\n\tValue(UI32): " << NetToSys.m_Value
       << "\n";

    return ss.str();
}